

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O3

int nghttp2_map_each(nghttp2_map *map,_func_int_void_ptr_void_ptr *func,void *ptr)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  uVar2 = map->tablelen;
  if (uVar2 == 0) {
    return 0;
  }
  lVar4 = 8;
  uVar5 = 0;
  do {
    pvVar1 = *(void **)((long)&map->table->hash + lVar4);
    if (pvVar1 != (void *)0x0) {
      iVar3 = (*func)(pvVar1,ptr);
      if (iVar3 != 0) {
        return iVar3;
      }
      uVar2 = map->tablelen;
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x10;
  } while (uVar5 < uVar2);
  return 0;
}

Assistant:

int nghttp2_map_each(nghttp2_map *map, int (*func)(void *data, void *ptr),
                     void *ptr) {
  int rv;
  uint32_t i;
  nghttp2_map_bucket *bkt;

  for (i = 0; i < map->tablelen; ++i) {
    bkt = &map->table[i];

    if (bkt->data == NULL) {
      continue;
    }

    rv = func(bkt->data, ptr);
    if (rv != 0) {
      return rv;
    }
  }

  return 0;
}